

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O0

int __thiscall MeCab::CharProperty::open(CharProperty *this,char *__file,int __oflag,...)

{
  uint uVar1;
  Mmap<char> *pMVar2;
  ostream *poVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 uVar6;
  char *s;
  uint i;
  size_t fsize;
  uint csize;
  char *ptr;
  ostringstream error;
  whatlog *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  value_type *in_stack_fffffffffffffd68;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffd70;
  uint local_1d4;
  wlog local_1d0;
  size_t local_1c8;
  uint local_1bc;
  CharInfo *local_1b8;
  undefined4 local_1ac;
  wlog local_1a8 [3];
  ostringstream local_190 [376];
  char *local_18;
  CharProperty *local_10;
  bool local_1;
  
  local_18 = __file;
  local_10 = this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  pMVar2 = scoped_ptr<MeCab::Mmap<char>_>::operator->(&this->cmmap_);
  uVar1 = Mmap<char>::open(pMVar2,local_18,0x169cac);
  if ((uVar1 & 1) == 0) {
    wlog::wlog((wlog *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58);
    poVar3 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x52);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"cmmap_->open(filename, \"r\")");
    poVar3 = std::operator<<(poVar3,"] ");
    local_1 = wlog::operator&(local_1a8,poVar3);
  }
  else {
    pMVar2 = scoped_ptr<MeCab::Mmap<char>_>::operator->(&this->cmmap_);
    local_1b8 = (CharInfo *)Mmap<char>::begin(pMVar2);
    read_static<unsigned_int>
              ((char **)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (uint *)in_stack_fffffffffffffd58);
    sVar4 = (ulong)(local_1bc << 5) + 0x40000;
    local_1c8 = sVar4;
    pMVar2 = scoped_ptr<MeCab::Mmap<char>_>::operator->(&this->cmmap_);
    sVar5 = Mmap<char>::size(pMVar2);
    if (sVar4 == sVar5) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x1276ab);
      for (local_1d4 = 0; local_1d4 < local_1bc; local_1d4 = local_1d4 + 1) {
        read_ptr((char **)&local_1b8,0x20);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      }
      this->map_ = local_1b8;
      local_1 = true;
    }
    else {
      wlog::wlog((wlog *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd58);
      poVar3 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5b);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"fsize == cmmap_->size()");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"invalid file size: ");
      poVar3 = std::operator<<(poVar3,local_18);
      local_1 = wlog::operator&(&local_1d0,poVar3);
    }
  }
  local_1ac = 1;
  uVar6 = std::__cxx11::ostringstream::~ostringstream(local_190);
  return (uint)CONCAT71((int7)((ulong)uVar6 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool CharProperty::open(const char *filename) {
  std::ostringstream error;
  CHECK_FALSE(cmmap_->open(filename, "r"));

  const char *ptr = cmmap_->begin();
  unsigned int csize;
  read_static<unsigned int>(&ptr, csize);

  size_t fsize = sizeof(unsigned int) +
      (32 * csize) + sizeof(unsigned int) * 0xffff;

  CHECK_FALSE(fsize == cmmap_->size())
      << "invalid file size: " << filename;

  clist_.clear();
  for (unsigned int i = 0; i < csize; ++i) {
    const char *s = read_ptr(&ptr, 32);
    clist_.push_back(s);
  }

  map_ = reinterpret_cast<const CharInfo *>(ptr);

  return true;
}